

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

QWidget * __thiscall QSplitter::replaceWidget(QSplitter *this,int index,QWidget *widget)

{
  undefined1 uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  QWidgetData *pQVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    replaceWidget();
  }
  else {
    if ((index < 0) ||
       (lVar3 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8,
       *(ulong *)(lVar3 + 0x298) <= (ulong)(uint)index)) {
      local_58.x1.m_i = 2;
      local_58.y1.m_i = 0;
      local_58.x2.m_i = 0;
      local_58.y2.m_i = 0;
      uStack_48 = 0;
      local_44 = 0;
      local_40 = "default";
      this_00 = (QWidget *)0x0;
      QMessageLogger::warning((char *)&local_58,"QSplitter::replaceWidget: Index %d out of range");
      goto LAB_0048ce72;
    }
    lVar4 = *(long *)(*(long *)(lVar3 + 0x290) + (ulong)(uint)index * 8);
    this_00 = *(QWidget **)(lVar4 + 0x18);
    if (this_00 == widget) {
      replaceWidget();
    }
    else {
      if (*(QSplitter **)(*(long *)&widget->field_0x8 + 0x10) != this) {
        uVar1 = *(undefined1 *)(lVar3 + 0x2ac);
        *(undefined1 *)(lVar3 + 0x2ac) = 1;
        pQVar5 = this_00->data;
        uVar6 = (pQVar5->crect).x1;
        uVar7 = (pQVar5->crect).y1;
        uVar8 = (pQVar5->crect).x2;
        uVar9 = (pQVar5->crect).y2;
        uVar2 = pQVar5->widget_attributes;
        *(QWidget **)(lVar4 + 0x18) = widget;
        local_58.x1.m_i = uVar6;
        local_58.y1.m_i = uVar7;
        local_58.x2.m_i = uVar8;
        local_58.y2.m_i = uVar9;
        QWidget::setParent(this_00,(QWidget *)0x0);
        QWidget::setParent(widget,(QWidget *)this);
        QWidget::setGeometry(widget,&local_58);
        QWidget::lower(widget);
        if ((uVar2 >> 0x10 & 1) == 0) {
          if ((*(byte *)(*(long *)(*(long *)(lVar3 + 8) + 0x20) + 9) & 0x80) != 0) {
            bVar10 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
            if (!bVar10) {
              QWidget::show(widget);
            }
          }
        }
        else {
          QWidget::hide(widget);
        }
        *(undefined1 *)(lVar3 + 0x2ac) = uVar1;
        goto LAB_0048ce72;
      }
      replaceWidget();
    }
  }
  this_00 = (QWidget *)0x0;
LAB_0048ce72:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QSplitter::replaceWidget(int index, QWidget *widget)
{
    Q_D(QSplitter);
    if (!widget) {
        qWarning("QSplitter::replaceWidget: Widget can't be null");
        return nullptr;
    }

    if (index < 0 || index >= d->list.size()) {
        qWarning("QSplitter::replaceWidget: Index %d out of range", index);
        return nullptr;
    }

    QSplitterLayoutStruct *s = d->list.at(index);
    QWidget *current = s->widget;
    if (current == widget) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with itself");
        return nullptr;
    }

    if (widget->parentWidget() == this) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with one of its siblings");
        return nullptr;
    }

    QScopedValueRollback b(d->blockChildAdd, true);

    const QRect geom = current->geometry();
    const bool wasHidden = current->isHidden();

    s->widget = widget;
    current->setParent(nullptr);
    widget->setParent(this);

    // The splitter layout struct's geometry is already set and
    // should not change. Only set the geometry on the new widget
    widget->setGeometry(geom);
    widget->lower();
    if (wasHidden)
        widget->hide();
    else if (d->shouldShowWidget(widget))
        widget->show();

    return current;
}